

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_avx512::forward_inplace(PReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint uVar2;
  uint *puVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  float *ptr;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [64];
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [64];
  ushort uVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  
  iVar25 = bottom_top_blob->elempack;
  iVar22 = bottom_top_blob->dims;
  iVar26 = bottom_top_blob->w;
  uVar34 = bottom_top_blob->h;
  uVar24 = bottom_top_blob->c;
  if (iVar22 == 3) {
    if (0 < (int)uVar24) {
      uVar34 = iVar26 * iVar25 * uVar34;
      auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar35 = 0;
      do {
        iVar22 = (this->super_PReLU).num_slope;
        uVar33 = uVar35 & 0xffffffff;
        if (iVar22 < 2) {
          uVar33 = 0;
        }
        uVar2 = *(uint *)((long)(this->super_PReLU).slope_data.data + uVar33 * 4);
        if (iVar22 < 2 || iVar25 != 4) {
          auVar48._4_4_ = uVar2;
          auVar48._0_4_ = uVar2;
          auVar48._8_4_ = uVar2;
          auVar48._12_4_ = uVar2;
        }
        else {
          auVar48 = *(undefined1 (*) [16])
                     ((long)(this->super_PReLU).slope_data.data + uVar35 * 0x10);
        }
        if (iVar25 == 8 && 1 < iVar22) {
          auVar50 = *(undefined1 (*) [32])
                     ((long)(this->super_PReLU).slope_data.data + uVar35 * 0x20);
        }
        else {
          auVar50._16_16_ = auVar48;
          auVar50._0_16_ = auVar48;
        }
        if (iVar25 == 0x10 && 1 < iVar22) {
          auVar42 = *(undefined1 (*) [64])
                     ((long)(this->super_PReLU).slope_data.data + uVar35 * 0x40);
        }
        else {
          auVar42 = vinsertf64x4_avx512f(ZEXT3264(auVar50),auVar50,1);
        }
        pauVar31 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar35 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar32 = 0;
        if (0xf < (int)uVar34) {
          iVar22 = 0xf;
          do {
            auVar40 = vmaxps_avx512f(*pauVar31,auVar44);
            auVar41 = vminps_avx512f(*pauVar31,auVar44);
            auVar40 = vfmadd213ps_avx512f(auVar41,auVar42,auVar40);
            *pauVar31 = auVar40;
            pauVar31 = pauVar31 + 1;
            iVar22 = iVar22 + 0x10;
            uVar32 = uVar34 & 0xfffffff0;
          } while (iVar22 < (int)uVar34);
        }
        uVar23 = uVar32 | 7;
        while ((int)uVar23 < (int)uVar34) {
          auVar46 = vmaxps_avx(*(undefined1 (*) [32])*pauVar31,ZEXT1632(ZEXT816(0) << 0x40));
          auVar49 = vminps_avx(*(undefined1 (*) [32])*pauVar31,ZEXT1632(ZEXT816(0) << 0x40));
          auVar45 = vfmadd213ps_fma(auVar49,auVar50,auVar46);
          *(undefined1 (*) [32])*pauVar31 = ZEXT1632(auVar45);
          pauVar31 = (undefined1 (*) [64])(*pauVar31 + 0x20);
          uVar23 = uVar32 + 0xf;
          uVar32 = uVar32 + 8;
        }
        uVar23 = uVar32 | 3;
        while ((int)uVar23 < (int)uVar34) {
          auVar45 = vmaxps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          auVar47 = vminps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          auVar45 = vfmadd213ps_fma(auVar47,auVar48,auVar45);
          *(undefined1 (*) [16])*pauVar31 = auVar45;
          pauVar31 = (undefined1 (*) [64])(*pauVar31 + 0x10);
          uVar23 = uVar32 + 7;
          uVar32 = uVar32 + 4;
        }
        if ((int)uVar32 < (int)uVar34) {
          auVar42 = vpbroadcastq_avx512f();
          auVar40 = vbroadcastss_avx512f(ZEXT416(uVar2));
          uVar33 = 0;
          do {
            auVar41 = vpbroadcastq_avx512f();
            auVar43 = vporq_avx512f(auVar41,auVar38);
            auVar41 = vporq_avx512f(auVar41,auVar39);
            uVar20 = vpcmpuq_avx512f(auVar41,auVar42,2);
            uVar21 = vpcmpuq_avx512f(auVar43,auVar42,2);
            bVar13 = (byte)uVar21;
            uVar37 = CONCAT11(bVar13,(byte)uVar20);
            piVar1 = (int *)(*pauVar31 + uVar33 * 4);
            auVar43._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * piVar1[1];
            auVar43._0_4_ = (uint)((byte)uVar20 & 1) * *piVar1;
            auVar43._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * piVar1[2];
            auVar43._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * piVar1[3];
            auVar43._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * piVar1[4];
            auVar43._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * piVar1[5];
            auVar43._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * piVar1[6];
            auVar43._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * piVar1[7];
            auVar43._32_4_ = (uint)(bVar13 & 1) * piVar1[8];
            auVar43._36_4_ = (uint)(bVar13 >> 1 & 1) * piVar1[9];
            auVar43._40_4_ = (uint)(bVar13 >> 2 & 1) * piVar1[10];
            auVar43._44_4_ = (uint)(bVar13 >> 3 & 1) * piVar1[0xb];
            auVar43._48_4_ = (uint)(bVar13 >> 4 & 1) * piVar1[0xc];
            auVar43._52_4_ = (uint)(bVar13 >> 5 & 1) * piVar1[0xd];
            auVar43._56_4_ = (uint)(bVar13 >> 6 & 1) * piVar1[0xe];
            auVar43._60_4_ = (uint)(bVar13 >> 7) * piVar1[0xf];
            uVar20 = vcmpps_avx512f(auVar43,auVar44,1);
            uVar37 = uVar37 & (ushort)uVar20;
            auVar41 = vmulps_avx512f(auVar43,auVar40);
            puVar3 = (uint *)(*pauVar31 + uVar33 * 4);
            bVar5 = (bool)((byte)uVar37 & 1);
            bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar37 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar37 >> 6) & 1);
            bVar12 = (bool)((byte)(uVar37 >> 7) & 1);
            bVar13 = (byte)(uVar37 >> 8);
            bVar14 = (bool)(bVar13 >> 1 & 1);
            bVar15 = (bool)(bVar13 >> 2 & 1);
            bVar16 = (bool)(bVar13 >> 3 & 1);
            bVar17 = (bool)(bVar13 >> 4 & 1);
            bVar18 = (bool)(bVar13 >> 5 & 1);
            bVar19 = (bool)(bVar13 >> 6 & 1);
            *puVar3 = (uint)bVar5 * auVar41._0_4_ | (uint)!bVar5 * *puVar3;
            puVar3[1] = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * puVar3[1];
            puVar3[2] = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * puVar3[2];
            puVar3[3] = (uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * puVar3[3];
            puVar3[4] = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * puVar3[4];
            puVar3[5] = (uint)bVar10 * auVar41._20_4_ | (uint)!bVar10 * puVar3[5];
            puVar3[6] = (uint)bVar11 * auVar41._24_4_ | (uint)!bVar11 * puVar3[6];
            puVar3[7] = (uint)bVar12 * auVar41._28_4_ | (uint)!bVar12 * puVar3[7];
            puVar3[8] = (uint)(bVar13 & 1) * auVar41._32_4_ | (uint)!(bool)(bVar13 & 1) * puVar3[8];
            puVar3[9] = (uint)bVar14 * auVar41._36_4_ | (uint)!bVar14 * puVar3[9];
            puVar3[10] = (uint)bVar15 * auVar41._40_4_ | (uint)!bVar15 * puVar3[10];
            puVar3[0xb] = (uint)bVar16 * auVar41._44_4_ | (uint)!bVar16 * puVar3[0xb];
            puVar3[0xc] = (uint)bVar17 * auVar41._48_4_ | (uint)!bVar17 * puVar3[0xc];
            puVar3[0xd] = (uint)bVar18 * auVar41._52_4_ | (uint)!bVar18 * puVar3[0xd];
            puVar3[0xe] = (uint)bVar19 * auVar41._56_4_ | (uint)!bVar19 * puVar3[0xe];
            puVar3[0xf] = (uint)(bVar13 >> 7) * auVar41._60_4_ |
                          (uint)!(bool)(bVar13 >> 7) * puVar3[0xf];
            uVar33 = uVar33 + 0x10;
          } while (((ulong)(~uVar32 + uVar34) + 0x10 & 0x1fffffff0) != uVar33);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar24);
    }
  }
  else if (iVar22 == 2) {
    if (0 < (int)uVar34) {
      uVar24 = iVar25 * iVar26;
      auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar35 = 0;
      do {
        iVar22 = (this->super_PReLU).num_slope;
        uVar33 = uVar35 & 0xffffffff;
        if (iVar22 < 2) {
          uVar33 = 0;
        }
        uVar2 = *(uint *)((long)(this->super_PReLU).slope_data.data + uVar33 * 4);
        if (iVar22 < 2 || iVar25 != 4) {
          auVar47._4_4_ = uVar2;
          auVar47._0_4_ = uVar2;
          auVar47._8_4_ = uVar2;
          auVar47._12_4_ = uVar2;
        }
        else {
          auVar47 = *(undefined1 (*) [16])
                     ((long)(this->super_PReLU).slope_data.data + uVar35 * 0x10);
        }
        if (iVar25 == 8 && 1 < iVar22) {
          auVar49 = *(undefined1 (*) [32])
                     ((long)(this->super_PReLU).slope_data.data + uVar35 * 0x20);
        }
        else {
          auVar49._16_16_ = auVar47;
          auVar49._0_16_ = auVar47;
        }
        if (iVar25 == 0x10 && 1 < iVar22) {
          auVar42 = *(undefined1 (*) [64])
                     ((long)(this->super_PReLU).slope_data.data + uVar35 * 0x40);
        }
        else {
          auVar42 = vinsertf64x4_avx512f(ZEXT3264(auVar49),auVar49,1);
        }
        pauVar31 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar35 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar32 = 0;
        if (0xf < (int)uVar24) {
          iVar22 = 0xf;
          do {
            auVar40 = vmaxps_avx512f(*pauVar31,auVar44);
            auVar41 = vminps_avx512f(*pauVar31,auVar44);
            auVar40 = vfmadd213ps_avx512f(auVar41,auVar42,auVar40);
            *pauVar31 = auVar40;
            pauVar31 = pauVar31 + 1;
            iVar22 = iVar22 + 0x10;
            uVar32 = uVar24 & 0xfffffff0;
          } while (iVar22 < (int)uVar24);
        }
        uVar23 = uVar32 | 7;
        while ((int)uVar23 < (int)uVar24) {
          auVar46 = vmaxps_avx(*(undefined1 (*) [32])*pauVar31,ZEXT1632(ZEXT816(0) << 0x40));
          auVar50 = vminps_avx(*(undefined1 (*) [32])*pauVar31,ZEXT1632(ZEXT816(0) << 0x40));
          auVar45 = vfmadd213ps_fma(auVar50,auVar49,auVar46);
          *(undefined1 (*) [32])*pauVar31 = ZEXT1632(auVar45);
          pauVar31 = (undefined1 (*) [64])(*pauVar31 + 0x20);
          uVar23 = uVar32 + 0xf;
          uVar32 = uVar32 + 8;
        }
        uVar23 = uVar32 | 3;
        while ((int)uVar23 < (int)uVar24) {
          auVar45 = vmaxps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          auVar48 = vminps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          auVar45 = vfmadd213ps_fma(auVar48,auVar47,auVar45);
          *(undefined1 (*) [16])*pauVar31 = auVar45;
          pauVar31 = (undefined1 (*) [64])(*pauVar31 + 0x10);
          uVar23 = uVar32 + 7;
          uVar32 = uVar32 + 4;
        }
        if ((int)uVar32 < (int)uVar24) {
          auVar42 = vpbroadcastq_avx512f();
          auVar40 = vbroadcastss_avx512f(ZEXT416(uVar2));
          uVar33 = 0;
          do {
            auVar41 = vpbroadcastq_avx512f();
            auVar43 = vporq_avx512f(auVar41,auVar38);
            auVar41 = vporq_avx512f(auVar41,auVar39);
            uVar20 = vpcmpuq_avx512f(auVar41,auVar42,2);
            uVar21 = vpcmpuq_avx512f(auVar43,auVar42,2);
            bVar13 = (byte)uVar21;
            uVar37 = CONCAT11(bVar13,(byte)uVar20);
            piVar1 = (int *)(*pauVar31 + uVar33 * 4);
            auVar41._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * piVar1[1];
            auVar41._0_4_ = (uint)((byte)uVar20 & 1) * *piVar1;
            auVar41._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * piVar1[2];
            auVar41._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * piVar1[3];
            auVar41._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * piVar1[4];
            auVar41._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * piVar1[5];
            auVar41._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * piVar1[6];
            auVar41._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * piVar1[7];
            auVar41._32_4_ = (uint)(bVar13 & 1) * piVar1[8];
            auVar41._36_4_ = (uint)(bVar13 >> 1 & 1) * piVar1[9];
            auVar41._40_4_ = (uint)(bVar13 >> 2 & 1) * piVar1[10];
            auVar41._44_4_ = (uint)(bVar13 >> 3 & 1) * piVar1[0xb];
            auVar41._48_4_ = (uint)(bVar13 >> 4 & 1) * piVar1[0xc];
            auVar41._52_4_ = (uint)(bVar13 >> 5 & 1) * piVar1[0xd];
            auVar41._56_4_ = (uint)(bVar13 >> 6 & 1) * piVar1[0xe];
            auVar41._60_4_ = (uint)(bVar13 >> 7) * piVar1[0xf];
            uVar20 = vcmpps_avx512f(auVar41,auVar44,1);
            uVar37 = uVar37 & (ushort)uVar20;
            auVar41 = vmulps_avx512f(auVar41,auVar40);
            puVar3 = (uint *)(*pauVar31 + uVar33 * 4);
            bVar5 = (bool)((byte)uVar37 & 1);
            bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar37 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar37 >> 6) & 1);
            bVar12 = (bool)((byte)(uVar37 >> 7) & 1);
            bVar13 = (byte)(uVar37 >> 8);
            bVar14 = (bool)(bVar13 >> 1 & 1);
            bVar15 = (bool)(bVar13 >> 2 & 1);
            bVar16 = (bool)(bVar13 >> 3 & 1);
            bVar17 = (bool)(bVar13 >> 4 & 1);
            bVar18 = (bool)(bVar13 >> 5 & 1);
            bVar19 = (bool)(bVar13 >> 6 & 1);
            *puVar3 = (uint)bVar5 * auVar41._0_4_ | (uint)!bVar5 * *puVar3;
            puVar3[1] = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * puVar3[1];
            puVar3[2] = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * puVar3[2];
            puVar3[3] = (uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * puVar3[3];
            puVar3[4] = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * puVar3[4];
            puVar3[5] = (uint)bVar10 * auVar41._20_4_ | (uint)!bVar10 * puVar3[5];
            puVar3[6] = (uint)bVar11 * auVar41._24_4_ | (uint)!bVar11 * puVar3[6];
            puVar3[7] = (uint)bVar12 * auVar41._28_4_ | (uint)!bVar12 * puVar3[7];
            puVar3[8] = (uint)(bVar13 & 1) * auVar41._32_4_ | (uint)!(bool)(bVar13 & 1) * puVar3[8];
            puVar3[9] = (uint)bVar14 * auVar41._36_4_ | (uint)!bVar14 * puVar3[9];
            puVar3[10] = (uint)bVar15 * auVar41._40_4_ | (uint)!bVar15 * puVar3[10];
            puVar3[0xb] = (uint)bVar16 * auVar41._44_4_ | (uint)!bVar16 * puVar3[0xb];
            puVar3[0xc] = (uint)bVar17 * auVar41._48_4_ | (uint)!bVar17 * puVar3[0xc];
            puVar3[0xd] = (uint)bVar18 * auVar41._52_4_ | (uint)!bVar18 * puVar3[0xd];
            puVar3[0xe] = (uint)bVar19 * auVar41._56_4_ | (uint)!bVar19 * puVar3[0xe];
            puVar3[0xf] = (uint)(bVar13 >> 7) * auVar41._60_4_ |
                          (uint)!(bool)(bVar13 >> 7) * puVar3[0xf];
            uVar33 = uVar33 + 0x10;
          } while (((ulong)(~uVar32 + uVar24) + 0x10 & 0x1fffffff0) != uVar33);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar34);
    }
  }
  else if (iVar22 == 1) {
    iVar25 = iVar25 * iVar26;
    pauVar31 = (undefined1 (*) [64])bottom_top_blob->data;
    puVar3 = (uint *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      uVar34 = *puVar3;
      iVar22 = iVar25 + 0xf;
      if (-1 < iVar25) {
        iVar22 = iVar25;
      }
      uVar24 = iVar22 >> 4;
      if (0xf < iVar25) {
        auVar38 = vbroadcastss_avx512f(ZEXT416(uVar34));
        uVar35 = (ulong)uVar24;
        pauVar36 = pauVar31;
        do {
          auVar39 = vmaxps_avx512f(*pauVar36,ZEXT1664(ZEXT816(0) << 0x40));
          auVar44 = vminps_avx512f(*pauVar36,ZEXT1664(ZEXT816(0) << 0x40));
          auVar39 = vfmadd213ps_avx512f(auVar44,auVar38,auVar39);
          *pauVar36 = auVar39;
          pauVar36 = pauVar36 + 1;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      iVar26 = iVar25 + uVar24 * -0x10;
      iVar22 = iVar26 + 7;
      if (-1 < iVar26) {
        iVar22 = iVar26;
      }
      if (7 < iVar26) {
        auVar46._4_4_ = uVar34;
        auVar46._0_4_ = uVar34;
        auVar46._8_4_ = uVar34;
        auVar46._12_4_ = uVar34;
        auVar46._16_4_ = uVar34;
        auVar46._20_4_ = uVar34;
        auVar46._24_4_ = uVar34;
        auVar46._28_4_ = uVar34;
        uVar35 = (ulong)(uint)(iVar22 >> 3);
        pauVar29 = (undefined1 (*) [32])(*pauVar31 + (long)(int)(uVar24 * 0x10) * 4);
        do {
          auVar49 = vmaxps_avx(*pauVar29,ZEXT1632(ZEXT816(0) << 0x40));
          auVar50 = vminps_avx(*pauVar29,ZEXT1632(ZEXT816(0) << 0x40));
          auVar45 = vfmadd213ps_fma(auVar50,auVar46,auVar49);
          *pauVar29 = ZEXT1632(auVar45);
          pauVar29 = pauVar29 + 1;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      iVar22 = uVar24 * 0x10 + (iVar22 >> 3) * 8;
      iVar27 = iVar25 - iVar22;
      iVar26 = iVar27 + 3;
      if (-1 < iVar27) {
        iVar26 = iVar27;
      }
      if (3 < iVar27) {
        auVar45._4_4_ = uVar34;
        auVar45._0_4_ = uVar34;
        auVar45._8_4_ = uVar34;
        auVar45._12_4_ = uVar34;
        uVar35 = (ulong)(uint)(iVar26 >> 2);
        pauVar30 = (undefined1 (*) [16])(*pauVar31 + (long)iVar22 * 4);
        do {
          auVar47 = vmaxps_avx(*pauVar30,ZEXT816(0) << 0x40);
          auVar48 = vminps_avx(*pauVar30,ZEXT816(0) << 0x40);
          auVar47 = vfmadd213ps_fma(auVar48,auVar45,auVar47);
          *pauVar30 = auVar47;
          pauVar30 = pauVar30 + 1;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      iVar22 = iVar22 + (iVar26 >> 2) * 4;
      if (iVar22 < iVar25) {
        lVar28 = (long)iVar22;
        auVar38 = vpbroadcastq_avx512f();
        auVar39 = vbroadcastss_avx512f(ZEXT416(uVar34));
        uVar35 = 0;
        auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar40 = vpbroadcastq_avx512f();
          auVar41 = vporq_avx512f(auVar40,auVar44);
          auVar40 = vporq_avx512f(auVar40,auVar42);
          uVar20 = vpcmpuq_avx512f(auVar40,auVar38,2);
          uVar21 = vpcmpuq_avx512f(auVar41,auVar38,2);
          bVar13 = (byte)uVar21;
          uVar37 = CONCAT11(bVar13,(byte)uVar20);
          piVar1 = (int *)(*pauVar31 + uVar35 * 4 + lVar28 * 4);
          auVar40._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * piVar1[1];
          auVar40._0_4_ = (uint)((byte)uVar20 & 1) * *piVar1;
          auVar40._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * piVar1[2];
          auVar40._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * piVar1[3];
          auVar40._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * piVar1[4];
          auVar40._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * piVar1[5];
          auVar40._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * piVar1[6];
          auVar40._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * piVar1[7];
          auVar40._32_4_ = (uint)(bVar13 & 1) * piVar1[8];
          auVar40._36_4_ = (uint)(bVar13 >> 1 & 1) * piVar1[9];
          auVar40._40_4_ = (uint)(bVar13 >> 2 & 1) * piVar1[10];
          auVar40._44_4_ = (uint)(bVar13 >> 3 & 1) * piVar1[0xb];
          auVar40._48_4_ = (uint)(bVar13 >> 4 & 1) * piVar1[0xc];
          auVar40._52_4_ = (uint)(bVar13 >> 5 & 1) * piVar1[0xd];
          auVar40._56_4_ = (uint)(bVar13 >> 6 & 1) * piVar1[0xe];
          auVar40._60_4_ = (uint)(bVar13 >> 7) * piVar1[0xf];
          uVar20 = vcmpps_avx512f(auVar40,ZEXT1664(ZEXT816(0) << 0x40),1);
          uVar37 = uVar37 & (ushort)uVar20;
          auVar40 = vmulps_avx512f(auVar40,auVar39);
          puVar3 = (uint *)(*pauVar31 + uVar35 * 4 + lVar28 * 4);
          bVar5 = (bool)((byte)uVar37 & 1);
          bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar37 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar37 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar37 >> 7) & 1);
          bVar13 = (byte)(uVar37 >> 8);
          bVar14 = (bool)(bVar13 >> 1 & 1);
          bVar15 = (bool)(bVar13 >> 2 & 1);
          bVar16 = (bool)(bVar13 >> 3 & 1);
          bVar17 = (bool)(bVar13 >> 4 & 1);
          bVar18 = (bool)(bVar13 >> 5 & 1);
          bVar19 = (bool)(bVar13 >> 6 & 1);
          *puVar3 = (uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * *puVar3;
          puVar3[1] = (uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * puVar3[1];
          puVar3[2] = (uint)bVar7 * auVar40._8_4_ | (uint)!bVar7 * puVar3[2];
          puVar3[3] = (uint)bVar8 * auVar40._12_4_ | (uint)!bVar8 * puVar3[3];
          puVar3[4] = (uint)bVar9 * auVar40._16_4_ | (uint)!bVar9 * puVar3[4];
          puVar3[5] = (uint)bVar10 * auVar40._20_4_ | (uint)!bVar10 * puVar3[5];
          puVar3[6] = (uint)bVar11 * auVar40._24_4_ | (uint)!bVar11 * puVar3[6];
          puVar3[7] = (uint)bVar12 * auVar40._28_4_ | (uint)!bVar12 * puVar3[7];
          puVar3[8] = (uint)(bVar13 & 1) * auVar40._32_4_ | (uint)!(bool)(bVar13 & 1) * puVar3[8];
          puVar3[9] = (uint)bVar14 * auVar40._36_4_ | (uint)!bVar14 * puVar3[9];
          puVar3[10] = (uint)bVar15 * auVar40._40_4_ | (uint)!bVar15 * puVar3[10];
          puVar3[0xb] = (uint)bVar16 * auVar40._44_4_ | (uint)!bVar16 * puVar3[0xb];
          puVar3[0xc] = (uint)bVar17 * auVar40._48_4_ | (uint)!bVar17 * puVar3[0xc];
          puVar3[0xd] = (uint)bVar18 * auVar40._52_4_ | (uint)!bVar18 * puVar3[0xd];
          puVar3[0xe] = (uint)bVar19 * auVar40._56_4_ | (uint)!bVar19 * puVar3[0xe];
          puVar3[0xf] = (uint)(bVar13 >> 7) * auVar40._60_4_ |
                        (uint)!(bool)(bVar13 >> 7) * puVar3[0xf];
          uVar35 = uVar35 + 0x10;
        } while (((iVar25 - lVar28) + 0xfU & 0xfffffffffffffff0) != uVar35);
      }
    }
    else {
      iVar22 = iVar25 + 0xf;
      if (-1 < iVar25) {
        iVar22 = iVar25;
      }
      uVar34 = iVar22 >> 4;
      if (0xf < iVar25) {
        uVar35 = (ulong)uVar34;
        lVar28 = 0;
        do {
          auVar38 = vmaxps_avx512f(*(undefined1 (*) [64])(*pauVar31 + lVar28),
                                   ZEXT1664(ZEXT816(0) << 0x40));
          auVar39 = vminps_avx512f(*(undefined1 (*) [64])(*pauVar31 + lVar28),
                                   ZEXT1664(ZEXT816(0) << 0x40));
          auVar38 = vfmadd132ps_avx512f(auVar39,auVar38,
                                        *(undefined1 (*) [64])((long)puVar3 + lVar28));
          *(undefined1 (*) [64])(*pauVar31 + lVar28) = auVar38;
          lVar28 = lVar28 + 0x40;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      iVar26 = iVar25 + uVar34 * -0x10;
      iVar22 = iVar26 + 7;
      if (-1 < iVar26) {
        iVar22 = iVar26;
      }
      if (7 < iVar26) {
        uVar35 = (ulong)(uint)(iVar22 >> 3);
        lVar28 = (long)(int)(uVar34 * 0x10) << 2;
        do {
          auVar46 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar31 + lVar28),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar49 = vminps_avx(*(undefined1 (*) [32])(*pauVar31 + lVar28),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar45 = vfmadd132ps_fma(auVar49,auVar46,*(undefined1 (*) [32])((long)puVar3 + lVar28));
          *(undefined1 (*) [32])(*pauVar31 + lVar28) = ZEXT1632(auVar45);
          lVar28 = lVar28 + 0x20;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      iVar22 = uVar34 * 0x10 + (iVar22 >> 3) * 8;
      iVar27 = iVar25 - iVar22;
      iVar26 = iVar27 + 3;
      if (-1 < iVar27) {
        iVar26 = iVar27;
      }
      uVar35 = (ulong)(uint)(iVar26 >> 2);
      if (3 < iVar27) {
        lVar28 = (long)iVar22 << 2;
        do {
          auVar45 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar31 + lVar28),ZEXT816(0) << 0x40);
          auVar47 = vminps_avx(*(undefined1 (*) [16])(*pauVar31 + lVar28),ZEXT816(0) << 0x40);
          auVar45 = vfmadd132ps_fma(auVar47,auVar45,*(undefined1 (*) [16])((long)puVar3 + lVar28));
          *(undefined1 (*) [16])(*pauVar31 + lVar28) = auVar45;
          lVar28 = lVar28 + 0x10;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      iVar22 = iVar22 + (iVar26 >> 2) * 4;
      if (iVar22 < iVar25) {
        pvVar4 = (this->super_PReLU).slope_data.data;
        lVar28 = (long)iVar22;
        do {
          if (*(float *)(*pauVar31 + lVar28 * 4) < 0.0) {
            *(float *)(*pauVar31 + lVar28 * 4) =
                 *(float *)(*pauVar31 + lVar28 * 4) * *(float *)((long)pvVar4 + lVar28 * 4);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < iVar25);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}